

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O1

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_point<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,point<double,_2UL,_boost::geometry::cs::cartesian> *p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  eps_policy<boost::geometry::math::detail::equals_factor_policy<double,_true>_> epsp;
  equals_factor_policy<double,_true> local_28;
  longdouble local_1c;
  
  local_28.factor = 1.0;
  dVar4 = strategy::side::side_by_triangle<void>::compute_side_value<double,double,false>::
          apply<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>,boost::geometry::strategy::side::side_by_triangle<void>::eps_policy<boost::geometry::math::detail::equals_factor_policy<double,true>>>
                    ((point<double,_2UL,_boost::geometry::cs::cartesian> *)this,
                     (point<double,_2UL,_boost::geometry::cs::cartesian> *)(this + 0x10),p,
                     (eps_policy<boost::geometry::math::detail::equals_factor_policy<double,_true>_>
                      *)&local_28);
  bVar1 = true;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
      bVar1 = ABS(dVar4) <= local_28.factor * 2.220446049250313e-16;
    }
    else {
      bVar1 = false;
    }
  }
  bVar2 = false;
  iVar3 = (uint)(0.0 < dVar4) * 2 + -1;
  if (bVar1) {
    iVar3 = 0;
  }
  if (iVar3 == *(short *)(this + 0x20)) {
    dVar4 = (*(double *)(this + 8) + *(double *)(this + 0x18)) * 0.5 - p->m_values[1];
    dVar5 = (*(double *)this + *(double *)(this + 0x10)) * 0.5 - p->m_values[0];
    dVar4 = dVar4 * dVar4 + dVar5 * dVar5 + 0.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    local_1c = (longdouble)dVar4;
    dVar4 = (*(double *)(this + 8) - *(double *)(this + 0x18)) *
            (*(double *)(this + 8) - *(double *)(this + 0x18)) +
            (*(double *)this - *(double *)(this + 0x10)) *
            (*(double *)this - *(double *)(this + 0x10)) + 0.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    bVar2 = local_1c <= (longdouble)dVar4 * (longdouble)0.5;
  }
  return bVar2;
}

Assistant:

bool intersects_point(OtherPoint const &p) const
    {
        return strategy::side::side_by_triangle<>::apply(s.first, s.second, p) == side
        && geometry::distance(return_centroid<Point>(s), p) <= geometry::length(s) / 2;
    }